

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManComputeCutLi(Aig_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  
  if (p->nTruePos != 0) {
    __assert_fail("Saig_ManPoNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                  ,0x44e,"Vec_Ptr_t *Llb_ManComputeCutLi(Aig_Man_t *)");
  }
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  pVVar1->pArray = ppvVar2;
  Aig_ManIncrementTravId(p);
  iVar6 = p->nRegs;
  if (0 < iVar6) {
    iVar9 = 0;
    uVar7 = 100;
    iVar5 = 0;
    do {
      uVar3 = p->nTruePos + iVar5;
      if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar8 = (void *)(*(ulong *)((long)p->vCos->pArray[uVar3] + 8) & 0xfffffffffffffffe);
      if (((*(uint *)((long)pvVar8 + 0x18) & 7) != 1) &&
         (*(int *)((long)pvVar8 + 0x20) != p->nTravIds)) {
        *(int *)((long)pvVar8 + 0x20) = p->nTravIds;
        iVar6 = (int)uVar7;
        if (iVar9 == iVar6) {
          if (iVar6 < 0x10) {
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
            }
            pVVar1->pArray = ppvVar2;
            pVVar1->nCap = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uint)(iVar6 * 2);
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(uVar7 * 8);
            }
            else {
              ppvVar2 = (void **)realloc(pVVar1->pArray,uVar7 * 8);
            }
            pVVar1->pArray = ppvVar2;
            pVVar1->nCap = iVar6 * 2;
          }
        }
        else {
          ppvVar2 = pVVar1->pArray;
        }
        lVar4 = (long)iVar9;
        iVar9 = iVar9 + 1;
        pVVar1->nSize = iVar9;
        ppvVar2[lVar4] = pvVar8;
        iVar6 = p->nRegs;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar6);
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLi( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 0 );
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId(p);
    Saig_ManForEachLi( p, pObj, i )
    {
        pObj = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pObj);
        Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}